

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# current_setting.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CurrentSettingBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  SettingLookupResult SVar1;
  int iVar2;
  reference this_00;
  pointer pEVar3;
  type expr;
  string *psVar4;
  undefined8 *puVar5;
  ParserException *pPVar6;
  ParameterNotResolvedException *this_01;
  string key;
  Value val;
  Value key_val;
  string local_120;
  LogicalType local_100;
  Value local_e8;
  Value local_a8;
  Value local_68;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  if ((pEVar3->return_type).id_ == UNKNOWN) {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  if ((pEVar3->return_type).id_ == VARCHAR) {
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    if ((pEVar3->return_type).id_ == VARCHAR) {
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar3);
      if ((char)iVar2 != '\0') {
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(this_00);
        ExpressionExecutor::EvaluateScalar(&local_68,context,expr,false);
        if (local_68.is_null == false) {
          psVar4 = StringValue::Get_abi_cxx11_(&local_68);
          if (psVar4->_M_string_length != 0) {
            psVar4 = StringValue::Get_abi_cxx11_(&local_68);
            StringUtil::Lower(&local_120,(string *)psVar4);
            LogicalType::LogicalType(&local_100,SQLNULL);
            Value::Value(&local_a8,&local_100);
            LogicalType::~LogicalType(&local_100);
            SVar1 = ClientContext::TryGetCurrentSetting(context,(string *)&local_120,&local_a8);
            if (SVar1.scope == INVALID) {
              Catalog::AutoloadExtensionByConfigName(context,(string *)&local_120);
              ClientContext::TryGetCurrentSetting(context,(string *)&local_120,&local_a8);
            }
            if ((Value *)&(bound_function->super_BaseScalarFunction).return_type != &local_a8) {
              (bound_function->super_BaseScalarFunction).return_type.id_ = local_a8.type_.id_;
              (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
                   local_a8.type_.physical_type_;
              shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                        (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                         &local_a8.type_.type_info_);
            }
            puVar5 = (undefined8 *)operator_new(0x48);
            Value::Value(&local_e8,&local_a8);
            *puVar5 = &PTR__CurrentSettingBindData_024bd3b8;
            Value::Value((Value *)(puVar5 + 1),&local_e8);
            Value::~Value(&local_e8);
            *(undefined8 **)this = puVar5;
            Value::~Value(&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p);
            }
            Value::~Value(&local_68);
            return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                   (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                   this;
          }
        }
        pPVar6 = (ParserException *)__cxa_allocate_exception(0x10);
        local_e8.type_._0_8_ = (long)&local_e8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,
                   "Key name for current_setting needs to be neither NULL nor empty","");
        ParserException::ParserException(pPVar6,(string *)&local_e8);
        __cxa_throw(pPVar6,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  pPVar6 = (ParserException *)__cxa_allocate_exception(0x10);
  local_e8.type_._0_8_ = (long)&local_e8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Key name for current_setting needs to be a constant string","");
  ParserException::ParserException(pPVar6,(string *)&local_e8);
  __cxa_throw(pPVar6,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> CurrentSettingBind(ClientContext &context, ScalarFunction &bound_function,
                                            vector<unique_ptr<Expression>> &arguments) {

	auto &key_child = arguments[0];
	if (key_child->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	if (key_child->return_type.id() != LogicalTypeId::VARCHAR ||
	    key_child->return_type.id() != LogicalTypeId::VARCHAR || !key_child->IsFoldable()) {
		throw ParserException("Key name for current_setting needs to be a constant string");
	}
	Value key_val = ExpressionExecutor::EvaluateScalar(context, *key_child);
	D_ASSERT(key_val.type().id() == LogicalTypeId::VARCHAR);
	if (key_val.IsNull() || StringValue::Get(key_val).empty()) {
		throw ParserException("Key name for current_setting needs to be neither NULL nor empty");
	}

	auto key = StringUtil::Lower(StringValue::Get(key_val));
	Value val;
	if (!context.TryGetCurrentSetting(key, val)) {
		Catalog::AutoloadExtensionByConfigName(context, key);
		// If autoloader didn't throw, the config is now available
		context.TryGetCurrentSetting(key, val);
	}

	bound_function.return_type = val.type();
	return make_uniq<CurrentSettingBindData>(val);
}